

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O0

MPP_RET __thiscall Mpp::notify(Mpp *this,RK_U32 flag)

{
  RK_U32 flag_local;
  Mpp *this_local;
  
  if (this->mType == MPP_CTX_DEC) {
    this_local._4_4_ = mpp_dec_notify(this->mDec,flag);
  }
  else if (this->mType == MPP_CTX_ENC) {
    this_local._4_4_ = mpp_enc_notify_v2(this->mEnc,flag);
  }
  else {
    _mpp_log_l(2,"mpp","unsupport context type %d\n",(char *)0x0,(ulong)this->mType);
    this_local._4_4_ = MPP_NOK;
  }
  return this_local._4_4_;
}

Assistant:

MPP_RET Mpp::notify(RK_U32 flag)
{
    switch (mType) {
    case MPP_CTX_DEC : {
        return mpp_dec_notify(mDec, flag);
    } break;
    case MPP_CTX_ENC : {
        return mpp_enc_notify_v2(mEnc, flag);
    } break;
    default : {
        mpp_err("unsupport context type %d\n", mType);
    } break;
    }
    return MPP_NOK;
}